

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O2

ForNonContainerNonPointer<my_error,_std::string> * __thiscall
lest::to_string<__lest_function__1822(lest::env&)::my_error>
          (ForNonContainerNonPointer<my_error,_std::string> *__return_storage_ptr__,lest *this,
          my_error *item)

{
  ulong *local_60;
  size_type local_58;
  ulong local_50;
  undefined8 uStack_48;
  ulong *local_40;
  size_type local_38;
  ulong local_30;
  undefined8 uStack_28;
  
  to_string_abi_cxx11_(0);
  if (local_60 == &local_50) {
    uStack_28 = uStack_48;
    local_40 = &local_30;
  }
  else {
    local_40 = local_60;
  }
  local_30 = local_50;
  local_38 = local_58;
  local_58 = 0;
  local_50 = local_50 & 0xffffffffffffff00;
  local_60 = &local_50;
  std::__cxx11::string::~string((string *)&local_60);
  if (local_40 == &local_30) {
    uStack_48 = uStack_28;
    local_60 = &local_50;
  }
  else {
    local_60 = local_40;
  }
  local_50 = local_30;
  local_58 = local_38;
  local_38 = 0;
  local_30 = local_30 & 0xffffffffffffff00;
  local_40 = &local_30;
  std::__cxx11::string::~string((string *)&local_40);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_60 == &local_50) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_50;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_48;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_60;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_50;
  }
  __return_storage_ptr__->_M_string_length = local_58;
  local_58 = 0;
  local_50 = local_50 & 0xffffffffffffff00;
  local_60 = &local_50;
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

auto to_string( T const & item ) -> ForNonContainerNonPointer<T, std::string>
{
    return make_string( item );
}